

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O3

bool __thiscall cppjieba::SegmentBase::ResetSeparators(SegmentBase *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  __hashtable *__h;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  RuneStrArray runes;
  char *local_328;
  long local_320;
  char local_318 [16];
  RuneStrArray local_308;
  Logger local_1b0;
  
  this_00 = &this->symbols_;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&this_00->_M_h);
  memset(&local_308,0,0x140);
  local_308.size_ = 0;
  local_308.capacity_ = 0x10;
  local_308.ptr_ = local_308.buffer_;
  bVar1 = DecodeRunesInString((s->_M_dataplus)._M_p,s->_M_string_length,&local_308);
  if (bVar1) {
    bVar1 = true;
    if (local_308.size_ != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        local_1b0._0_8_ = this_00;
        pVar5 = std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)this_00,(long)&((RuneStr *)&(local_308.ptr_)->rune)->rune + lVar4,
                           &local_1b0);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          limonp::Logger::Logger
                    (&local_1b0,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/SegmentBase.hpp"
                     ,0x22);
          std::__cxx11::string::substr((ulong)&local_328,(ulong)s);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1b0,local_328,local_320);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," already exists",0xf);
          if (local_328 != local_318) {
            operator_delete(local_328);
          }
          goto LAB_001154e4;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x14;
      } while (uVar3 < local_308.size_);
    }
  }
  else {
    limonp::Logger::Logger
              (&local_1b0,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/SegmentBase.hpp"
               ,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"decode ",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1b0,(s->_M_dataplus)._M_p,s->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed",7);
LAB_001154e4:
    limonp::Logger::~Logger(&local_1b0);
    bVar1 = false;
  }
  if ((RuneStrArray *)local_308.ptr_ != &local_308) {
    free(local_308.ptr_);
  }
  return bVar1;
}

Assistant:

bool ResetSeparators(const string& s) {
    symbols_.clear();
    RuneStrArray runes;
    if (!DecodeRunesInString(s, runes)) {
      XLOG(ERROR) << "decode " << s << " failed";
      return false;
    }
    for (size_t i = 0; i < runes.size(); i++) {
      if (!symbols_.insert(runes[i].rune).second) {
        XLOG(ERROR) << s.substr(runes[i].offset, runes[i].len) << " already exists";
        return false;
      }
    }
    return true;
  }